

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Rct.cpp
# Opt level: O0

int Rct::readLine(FILE *f,char *buf,int max)

{
  char *__s;
  size_t sVar1;
  char **local_4040;
  int local_4034;
  int len;
  char *ret;
  char bufbuf [16384];
  int max_local;
  char *buf_local;
  FILE *f_local;
  
  local_4040 = (char **)buf;
  bufbuf._16380_4_ = max;
  if (buf == (char *)0x0) {
    bufbuf[0x3ffc] = '\0';
    bufbuf[0x3ffd] = '@';
    bufbuf[0x3ffe] = '\0';
    bufbuf[0x3fff] = '\0';
    local_4040 = &ret;
  }
  __s = fgets((char *)local_4040,bufbuf._16380_4_,(FILE *)f);
  if (__s == (char *)0x0) {
    f_local._4_4_ = -1;
  }
  else {
    sVar1 = strlen(__s);
    local_4034 = (int)sVar1;
    if ((local_4034 != 0) && (__s[local_4034 + -1] == '\n')) {
      local_4034 = local_4034 + -1;
      __s[local_4034] = '\0';
    }
    f_local._4_4_ = local_4034;
  }
  return f_local._4_4_;
}

Assistant:

int readLine(FILE *f, char *buf, int max)
{
    char bufbuf[16384];
    if (!buf)
        max = sizeof(bufbuf);
    char *ret = fgets(buf ? buf : bufbuf, max, f);
    if (ret) {
        int len = strlen(ret);
        if (len && ret[len - 1] == '\n') {
            ret[--len] = '\0';
        }
        return len;
    }
    return -1;
}